

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Enum::Enum(Enum *this,string *name,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *values,uint32_t width)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  bool bVar1;
  reference __in;
  type *__args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar2 [16];
  string_view format_str;
  format_args args;
  Enum *local_130;
  Generator *local_128;
  undefined1 local_120 [8];
  shared_ptr<kratos::EnumConst> c;
  type *value;
  type *n;
  _Self local_f8;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range1;
  string local_d8;
  uint32_t local_a4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmStack_a0;
  uint32_t width_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *values_local;
  string *name_local;
  Enum *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a4 = width;
  pmStack_a0 = values;
  values_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)name;
  name_local = (string *)this;
  std::enable_shared_from_this<kratos::Enum>::enable_shared_from_this
            (&this->super_enable_shared_from_this<kratos::Enum>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
  ::map(&this->values);
  std::__cxx11::string::string((string *)&this->name,(string *)values_local);
  this->external = false;
  this->width_ = local_a4;
  this->local_ = true;
  bVar1 = is_valid_variable_name((string *)values_local);
  this_00 = pmStack_a0;
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    local_38 = &local_d8;
    local_40 = "{0} is a SystemVerilog keyword";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)values_local;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[31],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0} is a SystemVerilog keyword",(v7 *)values_local,auVar2._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "{0} is a SystemVerilog keyword");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_78.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_78.data_,format_str,args);
    UserException::UserException(auVar2._0_8_,&local_d8);
    __cxa_throw(auVar2._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::begin(pmStack_a0);
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_f8);
    if (!bVar1) break;
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator*(&__end1);
    __args = std::get<0ul,std::__cxx11::string_const,unsigned_long>(__in);
    c.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::get<1ul,std::__cxx11::string_const,unsigned_long>(__in);
    local_128 = Const::const_gen();
    local_130 = this;
    std::
    make_shared<kratos::EnumConst,kratos::Generator*,unsigned_long_const&,unsigned_int&,kratos::Enum*,std::__cxx11::string_const&>
              ((Generator **)local_120,(unsigned_long *)&local_128,
               (uint *)c.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(Enum **)&local_a4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::EnumConst>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumConst>&>
              ((map<std::__cxx11::string,std::shared_ptr<kratos::EnumConst>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
                *)&this->values,__args,(shared_ptr<kratos::EnumConst> *)local_120);
    std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_120);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Enum::Enum(const std::string &name, const std::map<std::string, uint64_t> &values, uint32_t width)
    : name(name), width_(width) {
    if (!is_valid_variable_name(name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    }
    for (auto const &[n, value] : values) {
        auto c = std::make_shared<EnumConst>(Const::const_gen(), value, width, this, n);
        this->values.emplace(n, c);
    }
}